

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O2

void __thiscall
classSHA256::finalizeHMAC(classSHA256 *this,void *key,size_t keyLen,void *hash,size_t hashLen)

{
  uint64_t *puVar1;
  uint8_t temp [32];
  
  (*(this->super_Hash)._vptr_Hash[6])(this,temp,0x20);
  Hash::formatHMACKey(&this->super_Hash,(this->state).w,key,keyLen,'\\');
  puVar1 = &(this->state).length;
  *puVar1 = *puVar1 + 0x200;
  processChunk(this);
  (*(this->super_Hash)._vptr_Hash[5])(this,temp,0x20);
  (*(this->super_Hash)._vptr_Hash[6])(this,hash,hashLen);
  clean<unsigned_char[32]>(&temp);
  return;
}

Assistant:

void classSHA256::finalizeHMAC(const void *key, size_t keyLen, void *hash, size_t hashLen)
{
    uint8_t temp[32];
    finalize(temp, sizeof(temp));
    formatHMACKey(state.w, key, keyLen, 0x5C);
    state.length += 64 * 8;
    processChunk();
    update(temp, sizeof(temp));
    finalize(hash, hashLen);
    clean(temp);
}